

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-01.cpp
# Opt level: O1

int __thiscall
baryonyx::itm::
solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>
::select_variables(solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>
                   *this,int r_size,int bkmin,int bkmax)

{
  float fVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  int unaff_R12D;
  bool bVar6;
  bool bVar7;
  double dVar8;
  
  iVar5 = bkmin;
  if (r_size < bkmin) {
    iVar5 = r_size;
  }
  if (bkmin == bkmax) {
    iVar5 = iVar5 + -1;
  }
  else {
    iVar3 = bkmax;
    if (r_size < bkmax) {
      iVar3 = r_size;
    }
    bVar2 = bkmax < iVar5;
    if (iVar5 <= bkmax) {
      if (bkmin < r_size) {
        r_size = bkmin;
      }
      if (iVar5 < iVar3) {
        iVar5 = iVar3;
      }
      unaff_R12D = r_size + -1;
      lVar4 = (long)r_size;
      do {
        fVar1 = (this->R)._M_t.
                super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[]>_>
                ._M_t.
                super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[]>_>
                .
                super__Head_base<0UL,_baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data_*,_false>
                ._M_head_impl[lVar4].value;
        bVar7 = fVar1 == 0.0;
        bVar6 = fVar1 < 0.0;
        if ((bVar7) && (!NAN(fVar1))) {
          dVar8 = std::
                  generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                            (this->rng);
          bVar7 = dVar8 == 0.5;
          bVar6 = 0.5 < dVar8;
        }
        if (!bVar6 && !bVar7) break;
        bVar2 = iVar3 <= lVar4;
        unaff_R12D = unaff_R12D + 1;
        lVar4 = lVar4 + 1;
      } while (iVar5 != unaff_R12D);
    }
    iVar5 = iVar3 + -1;
    if (!bVar2) {
      iVar5 = unaff_R12D;
    }
  }
  return iVar5;
}

Assistant:

int select_variables(const int r_size, int bkmin, int bkmax)
    {
        if (bkmin == bkmax)
            return std::min(bkmin, r_size) - 1;

        bkmin = std::min(bkmin, r_size);
        bkmax = std::min(bkmax, r_size);

        for (int i = bkmin; i <= bkmax; ++i)
            if (stop_iterating<Mode>(R[i].value, rng))
                return i - 1;

        return bkmax - 1;
    }